

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::modelDisplay(IMLE *this,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"-----------------------    Experts   ----",0x29);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < this->M) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"------ #",8);
      lVar4 = lVar4 + 1;
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      FastLinearExpert::modelDisplay
                ((FastLinearExpert *)
                 ((long)&(((this->experts).
                           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           .
                           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar5
                 ),out);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      lVar5 = lVar5 + 0x308;
    } while (lVar4 < this->M);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"-----------------------    Common    ----",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"M= ",3);
  plVar3 = (long *)std::ostream::operator<<(out,this->M);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sigma= ",7);
  poVar2 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sigma)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Psi= ",5);
  poVar2 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::modelDisplay(std::ostream &out) const
{
    out << "-----------------------    Experts   ----" << std::endl;
   for(int i = 0; i < M; i++)
    {
        out << "------ #" << i+1 << ":" << std::endl;
        experts[i].modelDisplay(out);
        out << std::endl;
    }

    out << "-----------------------    Common    ----" << std::endl;
    out << EXPAND( M ) << std::endl;
    out << EXPAND(Sigma) << std::endl;
    out << EXPAND(Psi) << std::endl;

}